

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>,unsigned_int>::KeyCompare<char_const*>
              (void *ap,void *bp)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)*bp;
  uVar3 = (ulong)*(ushort *)((long)bp + (uVar2 - (long)*(int *)((long)bp + uVar2)) + 4);
  iVar1 = strcmp((char *)((long)bp + (ulong)*(uint *)((long)bp + uVar3 + uVar2) + uVar3 + uVar2 + 4)
                 ,*ap);
  return -iVar1;
}

Assistant:

static int KeyCompare(const void *ap, const void *bp) {
    const K *key = reinterpret_cast<const K *>(ap);
    const uint8_t *data = reinterpret_cast<const uint8_t *>(bp);
    auto table = IndirectHelper<T>::Read(data, 0);

    // std::bsearch compares with the operands transposed, so we negate the
    // result here.
    return -table->KeyCompareWithValue(*key);
  }